

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AuxPtrs.h
# Opt level: O0

bool __thiscall
Js::AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)'\x10',_(unsigned_char)'\x01'>::Set
          (AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)__x10_,_(unsigned_char)__x01_>
           *this,AuxPointerType e,void *p)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint8 i;
  void *p_local;
  AuxPointerType e_local;
  AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)__x10_,_(unsigned_char)__x01_>
  *this_local;
  
  if (this->count != '\x01') {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/AuxPtrs.h"
                                ,0x67,"(count == _MaxCount)","count == _MaxCount");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = false;
  while( true ) {
    if (bVar2) {
      return false;
    }
    if ((this->type[0] == e) || (this->type[0] == Invalid)) break;
    bVar2 = true;
  }
  Memory::WriteBarrierPtr<void>::operator=(this->ptr,p);
  this->type[0] = e;
  return true;
}

Assistant:

inline bool AuxPtrsFix<FieldsEnum, size, _MaxCount>::Set(FieldsEnum e, void* p)
    {
        Assert(count == _MaxCount);
        for (uint8 i = 0; i < _MaxCount; i++)
        {
            if ((FieldsEnum) type[i] == e || (FieldsEnum) type[i] == FieldsEnum::Invalid)
            {
                ptr[i] = p;
                type[i] = e;
                return true;
            }
        }
        return false;
    }